

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  ostream *this_00;
  Type TVar1;
  TestPartResultArray *this_01;
  pointer pcVar2;
  int iVar3;
  TestPartResult *pTVar4;
  AssertionResult *pAVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int index;
  char *pcVar7;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  string expected;
  undefined1 local_78 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  undefined1 local_60 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = this->results_;
  TVar1 = this->type_;
  pcVar7 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar7,pcVar7 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_68);
  _Var8._M_head_impl = local_68._M_head_impl;
  if ((int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249 == 1) {
    pTVar4 = TestPartResultArray::GetTestPartResult(this_01,0);
    if (pTVar4->type_ == TVar1) {
      pcVar7 = strstr((pTVar4->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar7 != (char *)0x0) {
        local_60[0] = true;
        local_58._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        goto LAB_00342d17;
      }
      local_78[0] = false;
      local_70._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<((AssertionResult *)local_78,(char (*) [11])0x499a5c);
      pAVar5 = AssertionResult::operator<<(pAVar5,&local_50);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [14])" containing \"");
      pAVar5 = AssertionResult::operator<<(pAVar5,&this->substr_);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x49a577);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult((AssertionResult *)local_60,pAVar5);
    }
    else {
      local_78[0] = false;
      local_70._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar5 = AssertionResult::operator<<((AssertionResult *)local_78,(char (*) [11])0x499a5c);
      pAVar5 = AssertionResult::operator<<(pAVar5,&local_50);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [2])0x3b5426);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,pTVar4);
      AssertionResult::AssertionResult((AssertionResult *)local_60,pAVar5);
    }
  }
  else {
    this_00 = (ostream *)(local_68._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"  Actual: ",10);
    std::ostream::operator<<
              (this_00,(int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(this_00," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(_Var8._M_head_impl + 0x10),"\n",1);
        pTVar4 = TestPartResultArray::GetTestPartResult(this_01,index);
        _Var8._M_head_impl = local_68._M_head_impl;
        testing::operator<<((ostream *)(local_68._M_head_impl + 0x10),pTVar4);
        index = index + 1;
        iVar3 = (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4);
      } while (SBORROW4(index,iVar3 * -0x49249249) != index + iVar3 * 0x49249249 < 0);
    }
    local_78[0] = false;
    local_70._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    pAVar5 = AssertionResult::operator<<((AssertionResult *)local_78,(Message *)&local_68);
    AssertionResult::AssertionResult((AssertionResult *)local_60,pAVar5);
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_70._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70._M_head_impl);
  }
LAB_00342d17:
  if (local_68._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __ptr_00._M_head_impl = local_58._M_head_impl;
  if ((bool)local_60[0] != true) {
    Message::Message((Message *)&local_50);
    __ptr_00._M_head_impl = local_58._M_head_impl;
    if (local_58._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_58._M_head_impl;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
               ,0x416,pcVar7);
    AssertHelper::operator=((AssertHelper *)local_78,(Message *)&local_50);
    AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (__ptr_00._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,__ptr_00._M_head_impl);
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  paVar6 = &(this->substr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}